

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test2.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  ulong uVar5;
  reference pvVar6;
  result_type __x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> result;
  uint64_t old;
  bool exists;
  uint32_t row;
  uint32_t elem;
  uint64_t Nbefore;
  uint32_t Nsamples;
  uint32_t col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sparse;
  normal_distribution<double> dis_normal;
  uniform_int_distribution<unsigned_int> dis_row;
  mt19937_64 gen;
  random_device rd;
  uint32_t Ncol;
  uint32_t Nrow;
  double dens;
  uint in_stack_ffffffffffffe1a8;
  uint in_stack_ffffffffffffe1ac;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffe1b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  allocator_type *in_stack_ffffffffffffe1b8;
  normal_distribution<double> *in_stack_ffffffffffffe1c0;
  size_type in_stack_ffffffffffffe1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  undefined1 local_1e01 [33];
  size_type local_1de0;
  byte local_1dd1;
  result_type_conflict local_1dd0;
  uint local_1dcc;
  size_type local_1dc8;
  uint local_1dc0;
  uint local_1dbc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1db8 [107];
  random_device local_13a0;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0x3f847ae147ae147b;
  local_14 = 0x1000;
  local_18 = 0x1040;
  std::random_device::random_device(&local_13a0);
  std::random_device::operator()((random_device *)0x105416);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffe1b0,CONCAT44(in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a8)
            );
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)in_stack_ffffffffffffe1b0,
             in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a8);
  std::normal_distribution<double>::normal_distribution
            (in_stack_ffffffffffffe1c0,(result_type)in_stack_ffffffffffffe1b8,
             (result_type)in_stack_ffffffffffffe1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x105475);
  local_1dbc = 0;
  do {
    if (0x103f < local_1dbc) {
      local_1e01._1_8_ = 0;
      this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e01;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x105676);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (this_01,in_stack_ffffffffffffe1c8,(value_type_conflict2 *)in_stack_ffffffffffffe1c0
                 ,in_stack_ffffffffffffe1b8);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10569b);
      sVar3 = 0;
      this_00 = local_1db8;
      this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      uVar5 = sVar2 >> 1;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_1e01 + 9),
                          sVar3);
      blanczos(this,uVar5,0x1000,0x1040,pvVar6);
      local_4 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
      std::random_device::~random_device((random_device *)0x105729);
      return local_4;
    }
    __x = std::normal_distribution<double>::operator()
                    ((normal_distribution<double> *)in_stack_ffffffffffffe1b0,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)CONCAT44(in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a8));
    lVar1 = lrint(__x);
    local_1dc0 = (uint)lVar1;
    local_1dc8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_1db8);
    for (local_1dcc = 0; local_1dcc < local_1dc0; local_1dcc = local_1dcc + 1) {
      while (sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_1db8),
            sVar2 == local_1dc8 + (local_1dcc << 1)) {
        local_1dd0 = std::uniform_int_distribution<unsigned_int>::operator()
                               ((uniform_int_distribution<unsigned_int> *)in_stack_ffffffffffffe1b0,
                                (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                 *)CONCAT44(in_stack_ffffffffffffe1ac,in_stack_ffffffffffffe1a8));
        local_1dd1 = 0;
        for (local_1de0 = local_1dc8; sVar2 = local_1de0,
            sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_1db8),
            sVar2 < sVar3; local_1de0 = local_1de0 + 2) {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (local_1db8,local_1de0);
          if (*pvVar4 == local_1dd0) {
            local_1dd1 = 1;
            break;
          }
        }
        if ((local_1dd1 & 1) == 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffe1c0,(value_type_conflict *)in_stack_ffffffffffffe1b8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffe1c0,(value_type_conflict *)in_stack_ffffffffffffe1b8);
        }
      }
    }
    local_1dbc = local_1dbc + 1;
  } while( true );
}

Assistant:

int main()
{
    constexpr double   dens  = 0.01;
    constexpr uint32_t Nrow  = 1U << 12U;
    constexpr uint32_t Ncol  = Nrow + 64U;

    std::random_device rd;
    std::mt19937_64 gen(rd());
    std::uniform_int_distribution<uint32_t> dis_row(0U, Nrow - 1U);
    std::normal_distribution<double> dis_normal(dens * Nrow, 0.2 * dens * Nrow);

    std::vector<uint32_t> sparse;
    for (uint32_t col = 0U; col < Ncol; ++col)
    {
        const uint32_t Nsamples = lrint(dis_normal(gen));
        const uint64_t Nbefore  = sparse.size();
        for (uint32_t elem = 0U; elem < Nsamples; ++elem)
        {
            while (sparse.size() == Nbefore + 2U * elem)
            {
                const uint32_t row = dis_row(gen);
                bool exists = false;
                for (uint64_t old = Nbefore; old < sparse.size(); old += 2U)
                    if (sparse[old] == row)
                    {
                        exists = true;
                        break;
                    }
                if (!exists)
                {
                    sparse.push_back(row);
                    sparse.push_back(col);
                }
            }
        }
    }

    std::vector<uint64_t> result = std::vector<uint64_t>(Ncol, 0U);
    /*uint32_t Nsol =*/ blanczos(&sparse[0U], sparse.size() >> 1U, Nrow, Ncol, &result[0U]);
    
    return 0;
}